

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

Stream Catch::createStream(string *streamName)

{
  bool bVar1;
  streambuf *psVar2;
  domain_error *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  char *in_RDI;
  Stream SVar4;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  string local_48 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  Stream local_10;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    psVar2 = (streambuf *)std::ios::rdbuf();
    Stream::Stream(&local_10,psVar2,false);
    uVar3 = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      psVar2 = (streambuf *)std::ios::rdbuf();
      Stream::Stream(&local_10,psVar2,false);
      uVar3 = extraout_RDX_00;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (!bVar1) {
        this = (domain_error *)__cxa_allocate_exception(0x10);
        std::operator+(in_RDI,in_stack_ffffffffffffffe0);
        std::domain_error::domain_error(this,local_48);
        __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      psVar2 = (streambuf *)operator_new(0x148);
      StreamBufImpl<Catch::OutputDebugWriter,_256UL>::StreamBufImpl
                ((StreamBufImpl<Catch::OutputDebugWriter,_256UL> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      Stream::Stream(&local_10,psVar2,true);
      uVar3 = extraout_RDX_01;
    }
  }
  SVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  SVar4.isOwned = local_10.isOwned;
  SVar4.streamBuf = local_10.streamBuf;
  return SVar4;
}

Assistant:

Stream createStream( std::string const& streamName ) {
        if( streamName == "stdout" ) return Stream( std::cout.rdbuf(), false );
        if( streamName == "stderr" ) return Stream( std::cerr.rdbuf(), false );
        if( streamName == "debug" ) return Stream( new StreamBufImpl<OutputDebugWriter>, true );

        throw std::domain_error( "Unknown stream: " + streamName );
    }